

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ReduceProdLayerParams::ByteSizeLong(ReduceProdLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t size;
  size_t sVar3;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  ReduceProdLayerParams *this_local;
  
  data_size = 0;
  size = google::protobuf::internal::WireFormatLite::Int64Size(&this->axes_);
  if (size != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size((int32)size);
    data_size = sVar3 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(size);
  this->_axes_cached_byte_size_ = iVar2;
  data_size = size + data_size;
  bVar1 = keepdims(this);
  if (bVar1) {
    data_size = data_size + 2;
  }
  bVar1 = reduceall(this);
  if (bVar1) {
    data_size = data_size + 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t ReduceProdLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ReduceProdLayerParams)
  size_t total_size = 0;

  // repeated int64 axes = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->axes_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _axes_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // bool keepDims = 2;
  if (this->keepdims() != 0) {
    total_size += 1 + 1;
  }

  // bool reduceAll = 3;
  if (this->reduceall() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}